

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

bool __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::delete_node
          (KDTree<phosg::Vector2<long>,_long> *this,Node *n)

{
  logic_error *this_00;
  bool bVar1;
  Node *local_28;
  Node *target;
  Node *pNStack_18;
  bool was_leaf_node;
  Node *n_local;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  
  target._7_1_ = true;
  pNStack_18 = n;
  while( true ) {
    bVar1 = true;
    if (pNStack_18->before == (Node *)0x0) {
      bVar1 = pNStack_18->after_or_equal != (Node *)0x0;
    }
    if (!bVar1) break;
    target._7_1_ = false;
    if (pNStack_18->before == (Node *)0x0) {
      if (pNStack_18->after_or_equal == (Node *)0x0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        ::std::logic_error::logic_error(this_00,"node is a leaf but still claims to be movable");
        __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
      }
      local_28 = find_subtree_min_max(this,pNStack_18->after_or_equal,pNStack_18->dim,false);
    }
    else {
      local_28 = find_subtree_min_max(this,pNStack_18->before,pNStack_18->dim,true);
    }
    (pNStack_18->pt).field_0 = (local_28->pt).field_0;
    (pNStack_18->pt).field_1 = (local_28->pt).field_1;
    pNStack_18->value = local_28->value;
    pNStack_18 = local_28;
  }
  if (pNStack_18->parent == (Node *)0x0) {
    this->root = (Node *)0x0;
  }
  else {
    if (pNStack_18->parent->before == pNStack_18) {
      pNStack_18->parent->before = (Node *)0x0;
    }
    if (pNStack_18->parent->after_or_equal == pNStack_18) {
      pNStack_18->parent->after_or_equal = (Node *)0x0;
    }
  }
  this->node_count = this->node_count - 1;
  if (pNStack_18 != (Node *)0x0) {
    operator_delete(pNStack_18,0x38);
  }
  return target._7_1_;
}

Assistant:

bool KDTree<CoordType, ValueType>::delete_node(Node* n) {
  // replace the node with an appropriate node from its subtree, repeating until
  // the node is a leaf node
  bool was_leaf_node = true;
  while (n->before || n->after_or_equal) {
    was_leaf_node = false;
    Node* target;
    if (n->before) {
      target = KDTree::find_subtree_min_max(n->before, n->dim, true);
    } else if (n->after_or_equal) {
      target = KDTree::find_subtree_min_max(n->after_or_equal, n->dim, false);
    } else {
      throw std::logic_error("node is a leaf but still claims to be movable");
    }
    n->pt = target->pt;
    n->value = std::move(target->value);
    n = target;
  }

  // unlink the node from its parent
  if (n->parent == nullptr) {
    this->root = nullptr;
  } else {
    if (n->parent->before == n) {
      n->parent->before = nullptr;
    }
    if (n->parent->after_or_equal == n) {
      n->parent->after_or_equal = nullptr;
    }
  }

  // delete the (now-leaf) node
  this->node_count--;
  delete n;

  return was_leaf_node;
}